

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer_n.c
# Opt level: O1

void dump_symbol_list(TextBuffer *buf,LuaSymbolList *list,int level,char *delimiter)

{
  undefined4 *puVar1;
  char *pcVar2;
  undefined4 in_register_00000014;
  bool bVar3;
  uint uVar4;
  char *format;
  uint uVar5;
  PtrListIterator nodeiter__;
  PtrListIterator local_48;
  
  raviX_ptrlist_forward_iterator(&local_48,(PtrList *)list);
  puVar1 = (undefined4 *)raviX_ptrlist_iter_next(&local_48);
  if (puVar1 != (undefined4 *)0x0) {
    uVar4 = level + 1;
    uVar5 = level + 2;
    bVar3 = true;
    do {
      if (bVar3) {
        bVar3 = false;
      }
      else {
        printf_buf(buf,"%p%s\n",CONCAT44(in_register_00000014,level),",");
      }
      switch(*puVar1) {
      case 0:
        printf_buf(buf,"%pSymLocal {\n",(ulong)uVar4);
        printf_buf(buf,"%psymbol_id = %P,\n",(ulong)uVar5,puVar1);
        printf_buf(buf,"%pname = \'%t\',\n",(ulong)uVar5,*(undefined8 *)(puVar1 + 6));
        pcVar2 = raviX_get_type_name(puVar1[2]);
        printf_buf(buf,"%ptype_code = %s,\n",(ulong)uVar5,pcVar2);
        pcVar2 = "";
        if (*(long *)(puVar1 + 4) != 0) {
          pcVar2 = *(char **)(*(long *)(puVar1 + 4) + 0x10);
        }
        printf_buf(buf,"%ptype_name = \'%s\',\n",(ulong)uVar5,pcVar2);
        printf_buf(buf,"%pis_modified = %b,\n",(ulong)uVar5,
                   (ulong)(*(byte *)(puVar1 + 0xc) >> 2 & 1));
        printf_buf(buf,"%pis_function_argument = %b,\n",(ulong)uVar5,
                   (ulong)(*(byte *)(puVar1 + 0xc) >> 1 & 1));
        printf_buf(buf,"%pis_escaped = %b,\n",(ulong)uVar5,(ulong)(*(byte *)(puVar1 + 0xc) & 1));
        pcVar2 = *(char **)(puVar1 + 8);
        format = "%pscope_id = %P\n";
        break;
      case 1:
        printf_buf(buf,"%pSymUpvalue {\n",(ulong)uVar4);
        printf_buf(buf,"%ptarget_symbol_id = %P,\n",(ulong)uVar5,*(undefined8 *)(puVar1 + 6));
        printf_buf(buf,"%ptarget_variable_name = %t,\n",(ulong)uVar5,
                   *(undefined8 *)(*(long *)(puVar1 + 6) + 0x18));
        pcVar2 = raviX_get_type_name(*(ravitype_t *)(*(long *)(puVar1 + 6) + 8));
        printf_buf(buf,"%ptarget_type_code = %s,\n",(ulong)uVar5,pcVar2);
        pcVar2 = "";
        if (*(long *)(*(long *)(puVar1 + 6) + 0x10) != 0) {
          pcVar2 = *(char **)(*(long *)(*(long *)(puVar1 + 6) + 0x10) + 0x10);
        }
        printf_buf(buf,"%ptarget_type_name = \'%s\',\n",(ulong)uVar5,pcVar2);
        pcVar2 = (char *)(ulong)*(ushort *)(puVar1 + 10);
        format = "%pupvalue_index = %i\n";
        break;
      case 2:
        printf_buf(buf,"%pSymGlobal {\n",(ulong)uVar4);
        printf_buf(buf,"%psymbol_id = %P,\n",(ulong)uVar5,puVar1);
        printf_buf(buf,"%pname = \'%t\',\n",(ulong)uVar5,*(undefined8 *)(puVar1 + 6));
        pcVar2 = raviX_get_type_name(puVar1[2]);
        printf_buf(buf,"%ptype_code = %s,\n",(ulong)uVar5,pcVar2);
        pcVar2 = "";
        if (*(long *)(puVar1 + 4) != 0) {
          pcVar2 = *(char **)(*(long *)(puVar1 + 4) + 0x10);
        }
        format = "%ptype_name = \'%s\'\n";
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/ast_printer_n.c"
                      ,0xb6,"void dump_symbol(TextBuffer *, LuaSymbol *, int)");
      case 4:
        printf_buf(buf,"%pSymEnv {\n",(ulong)uVar4);
        printf_buf(buf,"%psymbol_id = %P,\n",(ulong)uVar5,puVar1);
        printf_buf(buf,"%pname = \'%t\',\n",(ulong)uVar5,*(undefined8 *)(puVar1 + 6));
        pcVar2 = raviX_get_type_name(puVar1[2]);
        printf_buf(buf,"%ptype_code = %s,\n",(ulong)uVar5,pcVar2);
        pcVar2 = "";
        if (*(long *)(puVar1 + 4) != 0) {
          pcVar2 = *(char **)(*(long *)(puVar1 + 4) + 0x10);
        }
        format = "%ptype_name = %s,\n";
      }
      printf_buf(buf,format,(ulong)uVar5,pcVar2);
      printf_buf(buf,"%p}\n",(ulong)uVar4);
      puVar1 = (undefined4 *)raviX_ptrlist_iter_next(&local_48);
    } while (puVar1 != (undefined4 *)0x0);
  }
  return;
}

Assistant:

static void dump_symbol_list(TextBuffer *buf, LuaSymbolList *list, int level, const char *delimiter)
{
	LuaSymbol *node;
	bool is_first = true;
	FOR_EACH_PTR(list, LuaSymbol, node)
	{
		if (is_first)
			is_first = false;
		else if (delimiter)
			printf_buf(buf, "%p%s\n", level, delimiter);
		dump_symbol(buf, node, level + 1);
	}
	END_FOR_EACH_PTR(node);
}